

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O2

String * __thiscall
String::format<1024ul>(String *__return_storage_ptr__,String *this,char *format,__va_list_tag *args)

{
  uint uVar1;
  va_list copy;
  char buffer [1024];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  char local_418 [1024];
  
  local_428 = *(undefined8 *)(format + 0x10);
  local_438 = *(undefined8 *)format;
  uStack_430 = *(undefined8 *)(format + 8);
  uVar1 = vsnprintf(local_418,0x400,(char *)this,format);
  (__return_storage_ptr__->mString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mString).field_2;
  (__return_storage_ptr__->mString)._M_string_length = 0;
  (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  if (uVar1 < 0x400) {
    assign(__return_storage_ptr__,local_418,(long)(int)uVar1);
  }
  else {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    vsnprintf((__return_storage_ptr__->mString)._M_dataplus._M_p,(long)(int)uVar1 + 1,(char *)this,
              &local_438);
  }
  return __return_storage_ptr__;
}

Assistant:

static String format(const char *format, va_list args)
    {
        va_list copy;
        va_copy(copy, args);

        char buffer[StaticBufSize];
        const size_t size = ::vsnprintf(buffer, StaticBufSize, format, args);
        assert(size >= 0);
        String ret;
        if (size < StaticBufSize) {
            ret.assign(buffer, size);
        } else {
            ret.resize(size);
            ::vsnprintf(&ret[0], size+1, format, copy);
        }
        va_end(copy);
        return ret;
    }